

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O0

void __thiscall test::OWDTimeStatistics::AddSample(OWDTimeStatistics *this,uint64_t owdUsec)

{
  uint uVar1;
  reference pvVar2;
  array<unsigned_long,_1000UL> *in_RSI;
  long in_RDI;
  size_type in_stack_ffffffffffffffd8;
  
  if (*(uint *)(in_RDI + 8000) < 1000) {
    *(int *)(in_RDI + 8000) = *(int *)(in_RDI + 8000) + 1;
  }
  pvVar2 = std::array<unsigned_long,_1000UL>::operator[](in_RSI,in_stack_ffffffffffffffd8);
  *pvVar2 = (value_type_conflict)in_RSI;
  uVar1 = *(int *)(in_RDI + 0x1f44) + 1;
  *(uint *)(in_RDI + 0x1f44) = uVar1;
  if (999 < uVar1) {
    *(undefined4 *)(in_RDI + 0x1f44) = 0;
  }
  return;
}

Assistant:

void OWDTimeStatistics::AddSample(uint64_t owdUsec)
{
    if (SampleCount < kMaxSamples)
        ++SampleCount;

    Samples[SampleIndex] = owdUsec;

    // Pick next sample index
    if (++SampleIndex >= kMaxSamples)
        SampleIndex = 0;
}